

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::internal::linked_ptr<testing::internal::ExpectationBase>::linked_ptr
          (linked_ptr<testing::internal::ExpectationBase> *this,
          linked_ptr<testing::internal::ExpectationBase> *ptr)

{
  ExpectationBase *pEVar1;
  linked_ptr_internal *this_00;
  
  if (ptr == this) {
    __assert_fail("&ptr != this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/./gtest/gtest.h"
                  ,0x2101,
                  "testing::internal::linked_ptr<testing::internal::ExpectationBase>::linked_ptr(const linked_ptr<T> &) [T = testing::internal::ExpectationBase]"
                 );
  }
  pEVar1 = ptr->value_;
  this->value_ = pEVar1;
  this_00 = &this->link_;
  if (pEVar1 != (ExpectationBase *)0x0) {
    linked_ptr_internal::join(this_00,&ptr->link_);
    return;
  }
  this_00->next_ = this_00;
  return;
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }